

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O1

void NOPL3_Reset(opl3_chip *chip,uint32_t clock,uint32_t samplerate)

{
  byte bVar1;
  int iVar2;
  opl3_chip **ppoVar3;
  undefined8 *puVar4;
  opl3_slot *poVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  opl3_channel *__s;
  ulong uVar10;
  opl3_channel *channel;
  long lVar11;
  
  __s = chip->channel;
  lVar11 = 0;
  memset(__s,0,0x1170);
  ppoVar3 = &chip->slot[0].chip;
  do {
    *ppoVar3 = chip;
    ppoVar3[2] = (opl3_chip *)&zeromod;
    *(undefined4 *)((long)ppoVar3 + 0x1a) = 0x1ff01ff;
    *(uint8_t *)((long)ppoVar3 + 0x1f) = '\x03';
    ppoVar3[5] = (opl3_chip *)&zeromod;
    *(uint8_t *)((long)ppoVar3 + 0x46) = (uint8_t)lVar11;
    lVar11 = lVar11 + 1;
    ppoVar3 = ppoVar3 + 10;
  } while (lVar11 != 0x24);
  uVar10 = 0;
  channel = __s;
  do {
    bVar1 = ""[uVar10];
    channel->slotz[0] = (opl3_slot *)((long)&chip->slot[0].channel + (ulong)((uint)bVar1 * 0x50));
    puVar4 = (undefined8 *)((long)&chip->slot[0].channel + (ulong)((uint)bVar1 * 0x50));
    poVar5 = (opl3_slot *)(puVar4 + 0x1e);
    channel->slotz[1] = poVar5;
    *puVar4 = channel;
    poVar5->channel = channel;
    uVar7 = (int)(uVar10 / 9) * -9 + (int)uVar10;
    if (uVar7 < 3) {
      uVar6 = uVar10 + 3;
LAB_0014f4c6:
      channel->pair = __s + uVar6;
    }
    else if (uVar7 < 6) {
      uVar6 = (ulong)((int)uVar10 - 3);
      goto LAB_0014f4c6;
    }
    channel->chip = chip;
    channel->out[0] = &zeromod;
    channel->out[1] = &zeromod;
    channel->out[2] = &zeromod;
    channel->out[3] = &zeromod;
    channel->chtype = '\0';
    channel->cha = 0xffff;
    channel->chb = 0xffff;
    channel->ch_num = (uint8_t)uVar10;
    OPL3_ChannelSetupAlg(channel);
    uVar10 = uVar10 + 1;
    channel = channel + 1;
    if (uVar10 == 0x12) {
      chip->noise = 1;
      chip->mixbuff[0] = 0;
      iVar2 = (int)(((ulong)samplerate * 0x48000) / (ulong)clock);
      uVar8 = iVar2 - 0x400;
      uVar7 = -uVar8;
      if (0 < (int)uVar8) {
        uVar7 = uVar8;
      }
      iVar9 = 0x400;
      if (1 < uVar7) {
        iVar9 = iVar2;
      }
      chip->rateratio = iVar9;
      chip->tremoloshift = '\x04';
      chip->vibshift = '\x01';
      chip->address = 0;
      chip->timer = 0;
      chip->tremolo = '\0';
      chip->tremolopos = '\0';
      chip->mixbuff[1] = 0;
      chip->samplecnt = 0;
      chip->oldsamples[0] = 0;
      chip->oldsamples[1] = 0;
      chip->samples[0] = 0;
      chip->samples[1] = 0;
      *(undefined4 *)((long)&chip->eg_timer + 7) = 0;
      chip->eg_timer = 0;
      chip->newm = '\0';
      chip->nts = '\0';
      chip->rhy = '\0';
      chip->vibpos = '\0';
      chip->rm_hh_bit2 = '\0';
      chip->rm_hh_bit3 = '\0';
      chip->rm_hh_bit7 = '\0';
      chip->rm_hh_bit8 = '\0';
      chip->rm_tc_bit3 = '\0';
      chip->rm_tc_bit5 = '\0';
      memset(&chip->writebuf_samplecnt,0,0x4018);
      return;
    }
  } while( true );
}

Assistant:

void NOPL3_Reset(opl3_chip *chip, uint32_t clock, uint32_t samplerate)
{
    opl3_slot *slot;
    opl3_channel *channel;
    uint8_t slotnum;
    uint8_t channum;
    uint8_t local_ch_slot;

    //memset(chip, 0, sizeof(opl3_chip));
    memset(chip->channel, 0x00, sizeof(opl3_channel) * 18);
    memset(chip->slot, 0x00, sizeof(opl3_slot) * 36);
    for (slotnum = 0; slotnum < 36; slotnum++)
    {
        slot = &chip->slot[slotnum];
        slot->chip = chip;
        slot->mod = &zeromod;
        slot->eg_rout = 0x1ff;
        slot->eg_out = 0x1ff;
        slot->eg_gen = envelope_gen_num_release;
        slot->trem = (const uint8_t*)&zeromod;
        slot->slot_num = slotnum;
    }
    for (channum = 0; channum < 18; channum++)
    {
        channel = &chip->channel[channum];
        local_ch_slot = ch_slot[channum];
        channel->slotz[0] = &chip->slot[local_ch_slot];
        channel->slotz[1] = &chip->slot[local_ch_slot + 3u];
        chip->slot[local_ch_slot].channel = &chip->channel[channum];
        chip->slot[local_ch_slot + 3u].channel = &chip->channel[channum];
        if ((channum % 9) < 3)
        {
            channel->pair = &chip->channel[channum + 3u];
        }
        else if ((channum % 9) < 6)
        {
            channel->pair = &chip->channel[channum - 3u];
        }
        channel->chip = chip;
        channel->out[0] = &zeromod;
        channel->out[1] = &zeromod;
        channel->out[2] = &zeromod;
        channel->out[3] = &zeromod;
        channel->chtype = ch_2op;
        channel->cha = 0xffff;
        channel->chb = 0xffff;
#if OPL_ENABLE_STEREOEXT
        channel->leftpan = 0x10000;
        channel->rightpan = 0x10000;
#endif
        channel->ch_num = channum;
        OPL3_ChannelSetupAlg(&chip->channel[channum]);
    }
    chip->noise = 1;
    //chip->rateratio = (samplerate << RSM_FRAC) / 49716;
    // ratio: sampleRate / (clock / 288) * (1 << resamplerFraction)
    chip->rateratio = (int32_t)((((uint64_t)288 * samplerate) << RSM_FRAC) / clock);
    if (abs(chip->rateratio - (1 << RSM_FRAC)) <= 1)
        chip->rateratio = (1 << RSM_FRAC);
    chip->tremoloshift = 4;
    chip->vibshift = 1;

#if OPL_ENABLE_STEREOEXT
    if (!panpot_lut_build)
    {
        int32_t i;
        for (i = 0; i < 256; i++)
        {
            panpot_lut[i] = OPL_SIN(i);
        }
        panpot_lut_build = 1;
    }
#endif

    chip->address = 0;
    chip->timer = 0;
    chip->eg_timer = 0;
    chip->eg_timerrem = chip->eg_state = chip->eg_add = 0;
    chip->newm = chip->nts = chip->rhy = chip->tremolo = 0;
    chip->vibpos = chip->tremolopos = 0;
    chip->mixbuff[0] = chip->mixbuff[1] = 0;
    chip->rm_hh_bit2 = chip->rm_hh_bit3 = chip->rm_hh_bit7 = chip->rm_hh_bit8 = 0;
    chip->rm_tc_bit3 = chip->rm_tc_bit5 = 0;

    chip->samplecnt = 0;
    chip->oldsamples[0] = chip->oldsamples[1] = 0;
    chip->samples[0] = chip->samples[1] = 0;
#ifdef NOPL_ENABLE_WRITEBUF
    chip->writebuf_samplecnt = 0;
    chip->writebuf_cur = chip->writebuf_last = 0;
    chip->writebuf_lasttime = 0;
    memset(chip->writebuf, 0x00, sizeof(opl3_writebuf) * OPL_WRITEBUF_SIZE);
#endif
}